

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Adjacency_Subgraph_local_global_Test::Adjacency_Subgraph_local_global_Test
          (Adjacency_Subgraph_local_global_Test *this)

{
  Adjacency_Subgraph_local_global_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Adjacency_Subgraph_local_global_Test_001df090;
  return;
}

Assistant:

TEST(Adjacency_Subgraph, local_global) {
  Adjacency_Graph graph = create_graph_structured<false>(3);

  // Test local_global on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.local_global(0), 1);
  EXPECT_EQ(subgraph.local_global(1), 3);
  EXPECT_EQ(subgraph.local_global(2), 4);
  EXPECT_EQ(subgraph.local_global(3), 5);
  EXPECT_EQ(subgraph.local_global(4), 7);

  // Test local_global on both level and primary parts of the subgraph.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  EXPECT_EQ(subgraph.local_global(0), 4);
  EXPECT_EQ(subgraph.local_global(1), 1);
  EXPECT_EQ(subgraph.local_global(2), 3);
  EXPECT_EQ(subgraph.local_global(3), 5);
  EXPECT_EQ(subgraph.local_global(4), 7);

  EXPECT_DEATH(subgraph.local_global(7) == 0, "./*");
}